

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_wsi_extract_from_loop(lws *wsi)

{
  lws *wsi_local;
  
  if ((wsi->desc).sockfd != -1) {
    __remove_wsi_socket_from_fds(wsi);
  }
  if ((((wsi->a).context)->event_loop_ops->destroy_wsi == (_func_void_lws_ptr *)0x0) &&
     (((wsi->a).context)->event_loop_ops->wsi_logical_close != (_func_int_lws_ptr *)0x0)) {
    (*((wsi->a).context)->event_loop_ops->wsi_logical_close)(wsi);
    wsi_local._4_4_ = 1;
  }
  else {
    if (((wsi->a).context)->event_loop_ops->destroy_wsi != (_func_void_lws_ptr *)0x0) {
      (*((wsi->a).context)->event_loop_ops->destroy_wsi)(wsi);
    }
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_wsi_extract_from_loop(struct lws *wsi)
{
	if (lws_socket_is_valid(wsi->desc.sockfd))
		__remove_wsi_socket_from_fds(wsi);

	if (!wsi->a.context->event_loop_ops->destroy_wsi &&
	    wsi->a.context->event_loop_ops->wsi_logical_close) {
		wsi->a.context->event_loop_ops->wsi_logical_close(wsi);
		return 1; /* close / destroy continues async */
	}

	if (wsi->a.context->event_loop_ops->destroy_wsi)
		wsi->a.context->event_loop_ops->destroy_wsi(wsi);

	return 0; /* he is destroyed */
}